

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Instruction::setImmediateOperand(Instruction *this,uint idx,uint immediate)

{
  reference rVar1;
  
  rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->idOperand,(ulong)idx);
  if ((*rVar1._M_p & rVar1._M_mask) == 0) {
    (this->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[idx] = immediate;
    return;
  }
  __assert_fail("!idOperand[idx]",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0x7b,"void spv::Instruction::setImmediateOperand(unsigned int, unsigned int)");
}

Assistant:

void setImmediateOperand(unsigned idx, unsigned int immediate) {
        assert(!idOperand[idx]);
        operands[idx] = immediate;
    }